

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::calcRootLogLikelihoods
          (BeagleCPU4StateImpl<float,_1,_0> *this,int bufferIndex,int categoryWeightsIndex,
          int stateFrequenciesIndex,int scalingFactorsIndex,double *outSumLogLikelihood)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  int iVar6;
  float *pfVar7;
  float *pfVar8;
  double *pdVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  float *pfVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 in_XMM3_Qb;
  
  pfVar7 = (this->super_BeagleCPUImpl<float,_1,_0>).gPartials[bufferIndex];
  pfVar8 = (this->super_BeagleCPUImpl<float,_1,_0>).gCategoryWeights[categoryWeightsIndex];
  uVar10 = (this->super_BeagleCPUImpl<float,_1,_0>).kPatternCount;
  if ((int)uVar10 < 1) {
    uVar12 = 0;
  }
  else {
    fVar1 = *pfVar8;
    pfVar17 = (this->super_BeagleCPUImpl<float,_1,_0>).integrationTmp;
    uVar12 = 0;
    uVar14 = uVar10;
    do {
      pfVar17[uVar12] = fVar1 * pfVar7[uVar12];
      pfVar17[uVar12 + 1] = fVar1 * pfVar7[uVar12 + 1];
      pfVar17[uVar12 + 2] = fVar1 * pfVar7[uVar12 + 2];
      pfVar17[uVar12 + 3] = fVar1 * pfVar7[uVar12 + 3];
      uVar12 = uVar12 + 4;
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
  }
  lVar13 = (long)(this->super_BeagleCPUImpl<float,_1,_0>).kCategoryCount;
  pfVar17 = (this->super_BeagleCPUImpl<float,_1,_0>).integrationTmp;
  if (1 < lVar13) {
    iVar6 = (this->super_BeagleCPUImpl<float,_1,_0>).kExtraPatterns;
    lVar15 = 1;
    do {
      iVar11 = (int)uVar12;
      if (0 < (int)uVar10) {
        fVar1 = pfVar8[lVar15];
        lVar16 = 0;
        uVar14 = uVar10;
        do {
          auVar19 = vfmadd213ss_fma(ZEXT416((uint)pfVar7[iVar11 + lVar16]),ZEXT416((uint)fVar1),
                                    ZEXT416((uint)pfVar17[lVar16]));
          pfVar17[lVar16] = auVar19._0_4_;
          auVar19 = vfmadd213ss_fma(ZEXT416((uint)pfVar7[(long)iVar11 + lVar16 + 1]),
                                    ZEXT416((uint)fVar1),ZEXT416((uint)pfVar17[lVar16 + 1]));
          pfVar17[lVar16 + 1] = auVar19._0_4_;
          auVar19 = vfmadd213ss_fma(ZEXT416((uint)pfVar7[(long)iVar11 + lVar16 + 2]),
                                    ZEXT416((uint)fVar1),ZEXT416((uint)pfVar17[lVar16 + 2]));
          pfVar17[lVar16 + 2] = auVar19._0_4_;
          auVar19 = vfmadd213ss_fma(ZEXT416((uint)pfVar7[(long)iVar11 + lVar16 + 3]),
                                    ZEXT416((uint)fVar1),ZEXT416((uint)pfVar17[lVar16 + 3]));
          pfVar17[lVar16 + 3] = auVar19._0_4_;
          lVar16 = lVar16 + 4;
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
        iVar11 = iVar11 + (int)lVar16;
      }
      uVar12 = (ulong)(uint)(iVar11 + iVar6 * 4);
      lVar15 = lVar15 + 1;
    } while (lVar15 != lVar13);
  }
  if (0 < (int)uVar10) {
    pfVar17 = pfVar17 + 3;
    lVar13 = 0;
    pfVar7 = (this->super_BeagleCPUImpl<float,_1,_0>).gStateFrequencies[stateFrequenciesIndex];
    fVar1 = pfVar7[1];
    fVar2 = *pfVar7;
    fVar3 = pfVar7[2];
    fVar4 = pfVar7[3];
    do {
      auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * pfVar17[-2])),ZEXT416((uint)fVar2),
                                ZEXT416((uint)pfVar17[-3]));
      auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)fVar3),ZEXT416((uint)pfVar17[-1]));
      auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)fVar4),ZEXT416((uint)*pfVar17));
      dVar18 = log((double)auVar19._0_4_);
      pfVar17 = pfVar17 + 4;
      (this->super_BeagleCPUImpl<float,_1,_0>).outLogLikelihoodsTmp[lVar13] = (float)dVar18;
      lVar13 = lVar13 + 1;
      uVar10 = (this->super_BeagleCPUImpl<float,_1,_0>).kPatternCount;
    } while (lVar13 < (int)uVar10);
  }
  if (scalingFactorsIndex != -1) {
    if ((int)uVar10 < 1) {
      *outSumLogLikelihood = 0.0;
      return 0;
    }
    uVar12 = 0;
    pfVar7 = (this->super_BeagleCPUImpl<float,_1,_0>).gScaleBuffers[scalingFactorsIndex];
    pfVar8 = (this->super_BeagleCPUImpl<float,_1,_0>).outLogLikelihoodsTmp;
    do {
      pfVar8[uVar12] = pfVar7[uVar12] + pfVar8[uVar12];
      uVar12 = uVar12 + 1;
    } while (uVar10 != uVar12);
  }
  *outSumLogLikelihood = 0.0;
  if ((int)uVar10 < 1) {
    return 0;
  }
  pdVar9 = (this->super_BeagleCPUImpl<float,_1,_0>).gPatternWeights;
  pfVar7 = (this->super_BeagleCPUImpl<float,_1,_0>).outLogLikelihoodsTmp;
  auVar19 = ZEXT816(0) << 0x40;
  uVar12 = 0;
  do {
    auVar20._0_8_ = (double)pfVar7[uVar12];
    auVar20._8_8_ = in_XMM3_Qb;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = pdVar9[uVar12];
    auVar19 = vfmadd231sd_fma(auVar19,auVar20,auVar5);
    uVar12 = uVar12 + 1;
    dVar18 = auVar19._0_8_;
    *outSumLogLikelihood = dVar18;
  } while (uVar10 != uVar12);
  return (uint)(!NAN(dVar18) && !NAN(dVar18)) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoods(const int bufferIndex,
                                                           const int categoryWeightsIndex,
                                                           const int stateFrequenciesIndex,
                                                const int scalingFactorsIndex,
                                                double* outSumLogLikelihood) {

    const REALTYPE* rootPartials = gPartials[bufferIndex];
    assert(rootPartials);
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];

    int u = 0;
    int v = 0;
    const REALTYPE wt0 = wt[0];
    for (int k = 0; k < kPatternCount; k++) {
        integrationTmp[v    ] = rootPartials[v    ] * wt0;
        integrationTmp[v + 1] = rootPartials[v + 1] * wt0;
        integrationTmp[v + 2] = rootPartials[v + 2] * wt0;
        integrationTmp[v + 3] = rootPartials[v + 3] * wt0;
        v += 4;
    }
    for (int l = 1; l < kCategoryCount; l++) {
        u = 0;
        const REALTYPE wtl = wt[l];
        for (int k = 0; k < kPatternCount; k++) {
            integrationTmp[u    ] += rootPartials[v    ] * wtl;
            integrationTmp[u + 1] += rootPartials[v + 1] * wtl;
            integrationTmp[u + 2] += rootPartials[v + 2] * wtl;
            integrationTmp[u + 3] += rootPartials[v + 3] * wtl;

            u += 4;
            v += 4;
        }
		v += 4 * kExtraPatterns;
    }

    return integrateOutStatesAndScale(integrationTmp, stateFrequenciesIndex, scalingFactorsIndex, outSumLogLikelihood);
}